

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.h
# Opt level: O1

void __thiscall CTcTokString::append(CTcTokString *this,char *p,size_t len)

{
  size_t sVar1;
  
  (*this->_vptr_CTcTokString[2])(this,this->buf_len_ + len);
  memcpy(this->buf_ + this->buf_len_,p,len);
  sVar1 = len + this->buf_len_;
  this->buf_len_ = sVar1;
  this->buf_[sVar1] = '\0';
  return;
}

Assistant:

virtual void append(const char *p, size_t len)
    {
        /* make sure we have space available */
        ensure_space(buf_len_ + len);

        /* copy the text onto the end of our buffer */
        memcpy(buf_ + buf_len_, p, len);

        /* add it to the length of the text */
        buf_len_ += len;

        /* null-terminte it */
        buf_[buf_len_] = '\0';
    }